

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O1

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
               (cmGeneratorTarget *target,ostream *os,ImportPropertyMap *properties,
               GenerateType type,string *config)

{
  _Rb_tree_node_base *p_Var1;
  cmMakefile *this;
  bool bVar2;
  auto_ptr<cmCompiledGeneratorExpression> this_00;
  bool bVar3;
  PolicyStatus PVar4;
  int iVar5;
  TargetType TVar6;
  ostream *poVar7;
  cmLocalGenerator *pcVar8;
  cmGeneratorTarget *this_01;
  _Rb_tree_node_base *p_Var9;
  cmLinkImplementation *pcVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  _Base_ptr p_Var12;
  pointer pbVar13;
  char *pcVar14;
  bool bVar15;
  string end;
  string local_290;
  allocator local_26d;
  GenerateType local_26c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeList;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string evaluated;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libraries;
  _Base_ptr local_1c8 [2];
  undefined1 local_1b8 [16];
  ostringstream w;
  undefined1 local_198;
  undefined7 uStack_197;
  ios_base local_138 [264];
  
  local_26c = type;
  PVar4 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022);
  if ((PVar4 == WARN) ||
     (PVar4 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022), PVar4 == OLD)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    pcVar14 = "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    if (local_26c == BUILD) {
      pcVar14 = "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&w,pcVar14,(ulong)(local_26c != BUILD) + 0x39);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w," set to OLD for target ",0x17)
    ;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&w,(target->Target->Name)._M_dataplus._M_p,
                        (target->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"The export will only work with CMP0022 set to NEW.",0x32);
    this = target->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this,AUTHOR_WARNING,&end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)end._M_dataplus._M_p != &end.field_2) {
      operator_delete(end._M_dataplus._M_p,
                      CONCAT71(end.field_2._M_allocated_capacity._1_7_,end.field_2._M_local_buf[0])
                      + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
    std::ios_base::~ios_base(local_138);
  }
  if ((properties->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"LOCAL_CPP_FEATURES := rtti exceptions\n",0x26);
    for (p_Var9 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(properties->_M_t)._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      p_Var1 = p_Var9 + 1;
      iVar5 = std::__cxx11::string::compare((char *)p_Var1);
      if (iVar5 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_CPP_FEATURES += ",0x16);
        pcVar14 = *(char **)(p_Var9 + 2);
        p_Var12 = p_Var9[2]._M_parent;
        poVar7 = os;
LAB_003c6a4e:
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar14,(long)p_Var12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)p_Var1);
        if (iVar5 == 0) {
          libraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          libraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          libraries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument((string *)(p_Var9 + 2),&libraries,false);
          _w = &stack0xfffffffffffffe68;
          local_198 = _S_red;
          end._M_dataplus._M_p = (pointer)&end.field_2;
          end._M_string_length = 0;
          end.field_2._M_local_buf[0] = '\0';
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&includeList.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)includeList.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          for (pbVar13 = libraries.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pbVar13 !=
              libraries.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; pbVar13 = pbVar13 + 1) {
            pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
            this_01 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar8,pbVar13);
            if (this_01 == (cmGeneratorTarget *)0x0) {
              cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&evaluated);
              cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&evaluated);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&evaluated);
              cmGeneratorExpression::Parse((cmGeneratorExpression *)&evaluated,(string *)&ge);
              cge.x_ = (cmCompiledGeneratorExpression *)evaluated._M_dataplus;
              evaluated._M_dataplus._M_p = (pointer)0x0;
              cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                        ((auto_ptr<cmCompiledGeneratorExpression> *)&evaluated);
              this_00 = cge;
              pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
              local_290._M_string_length = 0;
              local_290.field_2._M_local_buf[0] = '\0';
              pcVar14 = cmCompiledGeneratorExpression::Evaluate
                                  (this_00.x_,pcVar8,config,false,(cmGeneratorTarget *)0x0,
                                   (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                                   &local_290);
              std::__cxx11::string::string((string *)&evaluated,pcVar14,&local_26d);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != &local_290.field_2) {
                operator_delete(local_290._M_dataplus._M_p,
                                CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                         local_290.field_2._M_local_buf[0]) + 1);
              }
              if (local_26c == INSTALL) {
                std::__cxx11::string::substr((ulong)&local_290,(ulong)pbVar13);
                iVar5 = std::__cxx11::string::compare((char *)&local_290);
                bVar15 = iVar5 == 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                  operator_delete(local_290._M_dataplus._M_p,
                                  CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                           local_290.field_2._M_local_buf[0]) + 1);
                }
              }
              else {
                bVar15 = false;
              }
              bVar3 = cmsys::SystemTools::FileIsFullPath(&evaluated);
              bVar2 = true;
              if (!bVar3) {
                std::__cxx11::string::substr((ulong)local_1c8,(ulong)&evaluated);
                iVar5 = std::__cxx11::string::compare((char *)local_1c8);
                bVar2 = (bool)(bVar15 | iVar5 == 0);
              }
              if ((!bVar3) && (local_1c8[0] != (_Base_ptr)local_1b8)) {
                operator_delete(local_1c8[0],local_1b8._0_8_ + 1);
              }
              if (bVar2) {
                std::operator+(&local_290," ",&evaluated);
                std::__cxx11::string::_M_append
                          ((char *)&includeList,(ulong)local_290._M_dataplus._M_p);
LAB_003c6d70:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                  operator_delete(local_290._M_dataplus._M_p,
                                  CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                           local_290.field_2._M_local_buf[0]) + 1);
                }
              }
              else if (evaluated._M_string_length != 0) {
                std::operator+(&local_290," -l",&evaluated);
                std::__cxx11::string::_M_append
                          ((char *)&includeList,(ulong)local_290._M_dataplus._M_p);
                goto LAB_003c6d70;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)evaluated._M_dataplus._M_p != &evaluated.field_2) {
                operator_delete(evaluated._M_dataplus._M_p,
                                evaluated.field_2._M_allocated_capacity + 1);
              }
              cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
              cmGeneratorExpression::~cmGeneratorExpression(&ge);
            }
            else {
              TVar6 = cmGeneratorTarget::GetType(this_01);
              if ((TVar6 == SHARED_LIBRARY) ||
                 (TVar6 = cmGeneratorTarget::GetType(this_01), TVar6 == MODULE_LIBRARY)) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ge," ",pbVar13);
                std::__cxx11::string::_M_append((char *)&end,(ulong)ge.Backtrace.Bottom.State);
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ge," ",pbVar13);
                std::__cxx11::string::_M_append((char *)&w,(ulong)ge.Backtrace.Bottom.State);
              }
              if (ge.Backtrace.Bottom.State != (cmState *)&ge.Backtrace.Bottom.Position.Position) {
                operator_delete(ge.Backtrace.Bottom.State,ge.Backtrace.Bottom.Position.Position + 1)
                ;
              }
            }
          }
          if (end._M_string_length != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_SHARED_LIBRARIES :=",0x19);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,end._M_dataplus._M_p,end._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          }
          if (includeList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_EXPORT_LDLIBS :=",0x16);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,(char *)includeList.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                (long)includeList.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          }
          if (includeList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&includeList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(includeList.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((includeList.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end._M_dataplus._M_p != &end.field_2) {
            operator_delete(end._M_dataplus._M_p,
                            CONCAT71(end.field_2._M_allocated_capacity._1_7_,
                                     end.field_2._M_local_buf[0]) + 1);
          }
          if ((_Base_ptr)_w != (_Base_ptr)&stack0xfffffffffffffe68) {
            operator_delete(_w,CONCAT71(uStack_197,local_198) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&libraries);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)p_Var1);
          if (iVar5 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            pcVar14 = *(char **)(p_Var9 + 2);
            p_Var12 = p_Var9[2]._M_parent;
            goto LAB_003c6a4e;
          }
          _w = &stack0xfffffffffffffe68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&w,*(long *)(p_Var9 + 2),
                     (long)&(p_Var9[2]._M_parent)->_M_color + *(long *)(p_Var9 + 2));
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          includeList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument((string *)&w,&includeList,false);
          std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_EXPORT_C_INCLUDES := ",0x1b);
          end._M_dataplus._M_p = (pointer)&end.field_2;
          end._M_string_length = 0;
          end.field_2._M_local_buf[0] = '\0';
          for (pbVar13 = includeList.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pbVar13 !=
              includeList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; pbVar13 = pbVar13 + 1) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,end._M_dataplus._M_p,end._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
            std::__cxx11::string::_M_replace((ulong)&end,0,(char *)end._M_string_length,0x58648e);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end._M_dataplus._M_p != &end.field_2) {
            operator_delete(end._M_dataplus._M_p,
                            CONCAT71(end.field_2._M_allocated_capacity._1_7_,
                                     end.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&includeList);
          if ((_Base_ptr)_w != (_Base_ptr)&stack0xfffffffffffffe68) {
            operator_delete(_w,CONCAT71(uStack_197,local_198) + 1);
          }
        }
      }
    }
  }
  TVar6 = cmGeneratorTarget::GetType(target);
  if (TVar6 == STATIC_LIBRARY) {
    pcVar10 = cmGeneratorTarget::GetLinkImplementation(target,config);
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[4]>>
                       ((pcVar10->Languages).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pcVar10->Languages).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"CXX");
    if (_Var11._M_current !=
        (pcVar10->Languages).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_HAS_CPP := true\n",0x16);
    }
  }
  TVar6 = cmGeneratorTarget::GetType(target);
  if (TVar6 - STATIC_LIBRARY < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,&DAT_00568e10 + *(int *)(&DAT_00568e10 + (ulong)(TVar6 - STATIC_LIBRARY) * 4),0x23
              );
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (ImportPropertyMap::const_iterator pi = properties.begin();
         pi != properties.end(); ++pi) {
      if (pi->first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (pi->second) << "\n";
      } else if (pi->first == "INTERFACE_LINK_LIBRARIES") {
        // need to look at list in pi->second and see if static or shared
        // FindTargetToLink
        // target->GetLocalGenerator()->FindGeneratorTargetToUse()
        // then add to LOCAL_CPPFLAGS
        std::vector<std::string> libraries;
        cmSystemTools::ExpandListArgument(pi->second, libraries);
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        for (std::vector<std::string>::iterator i = libraries.begin();
             i != libraries.end(); ++i) {
          cmGeneratorTarget* gt =
            target->GetLocalGenerator()->FindGeneratorTargetToUse(*i);
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + *i;
            } else {
              staticLibs += " " + *i;
            }
          } else {
            // evaluate any generator expressions with the current
            // build type of the makefile
            cmGeneratorExpression ge;
            CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(*i);
            std::string evaluated =
              cge->Evaluate(target->GetLocalGenerator(), config);
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = i->substr(0, 3) == "../";
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(evaluated) ||
                evaluated.substr(0, 2) == "-l" || relpath) {
              ldlibs += " " + evaluated;
              // if it is not a path and does not have a -l then add -l
            } else if (!evaluated.empty()) {
              ldlibs += " -l" + evaluated;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (pi->first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = pi->second;
        std::vector<std::string> includeList;
        cmSystemTools::ExpandListArgument(includes, includeList);
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::vector<std::string>::iterator i = includeList.begin();
             i != includeList.end(); ++i) {
          os << end << *i;
          end = "\\\n";
        }
        os << "\n";
      } else {
        os << "# " << pi->first << " " << (pi->second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(config);
    if (std::find(li->Languages.begin(), li->Languages.end(), "CXX") !=
        li->Languages.end()) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}